

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNode.h
# Opt level: O0

ModportItemSyntax * __thiscall
slang::syntax::SeparatedSyntaxList<slang::syntax::ModportItemSyntax>::operator[]
          (SeparatedSyntaxList<slang::syntax::ModportItemSyntax> *this,size_t index)

{
  reference this_00;
  SyntaxNode *this_01;
  ModportItemSyntax *pMVar1;
  size_t index_local;
  SeparatedSyntaxList<slang::syntax::ModportItemSyntax> *this_local;
  
  this_00 = nonstd::span_lite::span<slang::syntax::TokenOrSyntax,_18446744073709551615UL>::
            operator[](&this->elements,index << 1);
  this_01 = TokenOrSyntax::node(this_00);
  pMVar1 = SyntaxNode::as<slang::syntax::ModportItemSyntax>(this_01);
  return pMVar1;
}

Assistant:

T* operator[](size_t index) {
        index <<= 1;
        return &elements[index].node()->template as<T>();
    }